

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O0

int pkcs7_bundle_crls_cb(CBB *out,void *arg)

{
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  bool local_81;
  int len;
  uint8_t *buf;
  X509_CRL *crl;
  CBB crl_data;
  size_t i;
  stack_st_X509_CRL *crls;
  void *arg_local;
  CBB *out_local;
  
  iVar2 = CBB_add_asn1(out,(CBB *)&crl,0xa0000001);
  if (iVar2 == 0) {
    out_local._4_4_ = 0;
  }
  else {
    for (crl_data.u._24_8_ = 0; uVar1 = crl_data.u._24_8_,
        sVar3 = sk_X509_CRL_num((stack_st_X509_CRL *)arg), (ulong)uVar1 < sVar3;
        crl_data.u._24_8_ = crl_data.u._24_8_ + 1) {
      buf = (uint8_t *)sk_X509_CRL_value((stack_st_X509_CRL *)arg,crl_data.u._24_8_);
      iVar2 = i2d_X509_CRL((X509_CRL *)buf,(uchar **)0x0);
      if (((iVar2 < 0) ||
          (iVar2 = CBB_add_space((CBB *)&crl,(uint8_t **)&stack0xffffffffffffff90,(long)iVar2),
          iVar2 == 0)) ||
         (iVar2 = i2d_X509_CRL((X509_CRL *)buf,(uchar **)&stack0xffffffffffffff90), iVar2 < 0)) {
        return 0;
      }
    }
    iVar2 = CBB_flush_asn1_set_of((CBB *)&crl);
    local_81 = false;
    if (iVar2 != 0) {
      iVar2 = CBB_flush(out);
      local_81 = iVar2 != 0;
    }
    out_local._4_4_ = (uint)local_81;
  }
  return out_local._4_4_;
}

Assistant:

static int pkcs7_bundle_crls_cb(CBB *out, void *arg) {
  auto *crls = static_cast<const STACK_OF(X509_CRL) *>(arg);
  size_t i;
  CBB crl_data;

  // See https://tools.ietf.org/html/rfc2315#section-9.1
  if (!CBB_add_asn1(out, &crl_data,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 1)) {
    return 0;
  }

  for (i = 0; i < sk_X509_CRL_num(crls); i++) {
    X509_CRL *crl = sk_X509_CRL_value(crls, i);
    uint8_t *buf;
    int len = i2d_X509_CRL(crl, NULL);

    if (len < 0 || !CBB_add_space(&crl_data, &buf, len) ||
        i2d_X509_CRL(crl, &buf) < 0) {
      return 0;
    }
  }

  // |crl_data| is a implicitly-tagged SET OF.
  return CBB_flush_asn1_set_of(&crl_data) && CBB_flush(out);
}